

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5CsrPoslist(Fts5Cursor *pCsr,int iPhrase,u8 **pa,int *pn)

{
  Fts5Expr *pFVar1;
  Fts5Config *pConfig;
  Fts5ExprPhrase **ppFVar2;
  long *plVar3;
  Fts5Colset *pFVar4;
  Fts5ExprPhrase *pFVar5;
  int iVar6;
  int iVar7;
  void *__s;
  long lVar8;
  int iVar9;
  Fts5Sorter *pFVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  int n;
  char *z;
  int local_5c;
  char *local_58;
  Fts5Expr *local_50;
  void *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar9 = 0x19;
  if (-1 < iPhrase) {
    pFVar1 = pCsr->pExpr;
    if (pFVar1 == (Fts5Expr *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = pFVar1->nPhrase;
    }
    if (iPhrase < iVar6) {
      pFVar10 = pCsr->pSorter;
      pConfig = (Fts5Config *)(pCsr->base).pVtab[1].pModule;
      if (pConfig->eDetail == 0) {
        if ((pCsr->csrflags & 0x40U) != 0) {
          pCsr->csrflags = pCsr->csrflags & 0xffffffbf;
        }
LAB_001ec623:
        if ((pFVar10 != (Fts5Sorter *)0x0) && (pConfig->eDetail == 0)) {
          iVar9 = 0;
          iVar6 = 0;
          if (iPhrase != 0) {
            iVar6 = pFVar10->aIdx[(long)iPhrase + -1];
          }
          *pn = pFVar10->aIdx[(uint)iPhrase] - iVar6;
          *pa = pFVar10->aPoslist + iVar6;
          goto LAB_001ec66e;
        }
        pFVar5 = pCsr->pExpr->apExprPhrase[(uint)iPhrase];
        if ((pFVar5->pNode->bEof == 0) && (pFVar5->pNode->iRowid == pCsr->pExpr->pRoot->iRowid)) {
          *pa = (pFVar5->poslist).p;
          iVar9 = (pFVar5->poslist).n;
        }
        else {
          *pa = (u8 *)0x0;
          iVar9 = 0;
        }
        *pn = iVar9;
      }
      else {
        if ((pConfig->eContent & 0xfffffffdU) != 1) {
          if ((pCsr->csrflags & 0x40) != 0) {
            iVar6 = pFVar1->nPhrase;
            iVar7 = sqlite3_initialize();
            iVar9 = 7;
            if ((iVar7 == 0) && (__s = sqlite3Malloc((long)iVar6 << 4), __s != (void *)0x0)) {
              memset(__s,0,(long)pFVar1->nPhrase << 4);
              iVar9 = pFVar1->nPhrase;
              if (0 < (long)iVar9) {
                ppFVar2 = pFVar1->apExprPhrase;
                lVar8 = 0;
                do {
                  plVar3 = *(long **)((long)ppFVar2 + lVar8);
                  if ((pFVar10 == (Fts5Sorter *)0x0) &&
                     ((((int)plVar3[2] == 0 || (*(long *)(*plVar3 + 0x18) != pFVar1->pRoot->iRowid))
                      || (*(int *)(*plVar3 + 4) != 0)))) {
                    *(undefined4 *)((long)__s + lVar8 * 2 + 0xc) = 1;
                  }
                  else {
                    *(undefined4 *)(plVar3 + 2) = 0;
                  }
                  lVar8 = lVar8 + 8;
                } while ((long)iVar9 * 8 != lVar8);
              }
              iVar9 = fts5SeekCursor(pCsr,0);
              if (iVar9 == 0 && 0 < pConfig->nCol) {
                uVar12 = 0;
                do {
                  local_58 = (char *)0x0;
                  local_5c = 0;
                  iVar9 = fts5TextFromStmt(pConfig,pCsr->pStmt,(int)uVar12,&local_58,&local_5c);
                  if (iVar9 == 0) {
                    local_50 = pCsr->pExpr;
                    local_40 = (uVar12 << 0x20) + -1;
                    iVar9 = local_50->nPhrase;
                    if (0 < (long)iVar9) {
                      ppFVar2 = local_50->apExprPhrase;
                      lVar8 = 0;
                      do {
                        pFVar4 = ppFVar2[lVar8]->pNode->pNear->pColset;
                        if (pFVar4 == (Fts5Colset *)0x0) {
LAB_001ec59a:
                          if (*(int *)((long)__s + lVar8 * 0x10 + 0xc) != 0) goto LAB_001ec5a9;
                          *(undefined4 *)((long)__s + lVar8 * 0x10 + 8) = 1;
                        }
                        else {
                          if (0 < (long)pFVar4->nCol) {
                            lVar11 = 0;
                            do {
                              if (uVar12 == (uint)pFVar4->aiCol[lVar11]) goto LAB_001ec59a;
                              lVar11 = lVar11 + 1;
                            } while (pFVar4->nCol != lVar11);
                          }
LAB_001ec5a9:
                          *(undefined4 *)((long)__s + lVar8 * 0x10 + 8) = 0;
                        }
                        lVar8 = lVar8 + 1;
                      } while (lVar8 != iVar9);
                    }
                    local_48 = __s;
                    iVar9 = sqlite3Fts5Tokenize(pConfig,4,local_58,local_5c,&local_50,
                                                fts5ExprPopulatePoslistsCb);
                  }
                  (pConfig->t).pLocale = (char *)0x0;
                  (pConfig->t).nLocale = 0;
                  uVar12 = uVar12 + 1;
                } while (((long)uVar12 < (long)pConfig->nCol) && (iVar9 == 0));
              }
            }
            else {
              __s = (void *)0x0;
            }
            sqlite3_free(__s);
            if (pCsr->pSorter != (Fts5Sorter *)0x0) {
              fts5ExprCheckPoslists(pCsr->pExpr->pRoot,pCsr->pSorter->iRowid);
            }
            *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xbf;
            if (iVar9 != 0) goto LAB_001ec446;
            pFVar10 = pCsr->pSorter;
          }
          goto LAB_001ec623;
        }
        *pa = (u8 *)0x0;
        *pn = 0;
      }
      iVar9 = 0;
      goto LAB_001ec66e;
    }
  }
LAB_001ec446:
  *pa = (u8 *)0x0;
  *pn = 0;
LAB_001ec66e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar9;
}

Assistant:

static int fts5CsrPoslist(
  Fts5Cursor *pCsr,               /* Fts5 cursor object */
  int iPhrase,                    /* Phrase to find position list for */
  const u8 **pa,                  /* OUT: Pointer to position list buffer */
  int *pn                         /* OUT: Size of (*pa) in bytes */
){
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;
  int rc = SQLITE_OK;
  int bLive = (pCsr->pSorter==0);

  if( iPhrase<0 || iPhrase>=sqlite3Fts5ExprPhraseCount(pCsr->pExpr) ){
    rc = SQLITE_RANGE;
  }else if( pConfig->eDetail!=FTS5_DETAIL_FULL
         && fts5IsContentless((Fts5FullTable*)pCsr->base.pVtab, 1)
  ){
    *pa = 0;
    *pn = 0;
    return SQLITE_OK;
  }else if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_POSLIST) ){
    if( pConfig->eDetail!=FTS5_DETAIL_FULL ){
      Fts5PoslistPopulator *aPopulator;
      int i;

      aPopulator = sqlite3Fts5ExprClearPoslists(pCsr->pExpr, bLive);
      if( aPopulator==0 ) rc = SQLITE_NOMEM;
      if( rc==SQLITE_OK ){
        rc = fts5SeekCursor(pCsr, 0);
      }
      for(i=0; i<pConfig->nCol && rc==SQLITE_OK; i++){
        const char *z = 0;
        int n = 0;
        rc = fts5TextFromStmt(pConfig, pCsr->pStmt, i, &z, &n);
        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5ExprPopulatePoslists(
              pConfig, pCsr->pExpr, aPopulator, i, z, n
          );
        }
        sqlite3Fts5ClearLocale(pConfig);
      }
      sqlite3_free(aPopulator);

      if( pCsr->pSorter ){
        sqlite3Fts5ExprCheckPoslists(pCsr->pExpr, pCsr->pSorter->iRowid);
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_POSLIST);
  }

  if( rc==SQLITE_OK ){
    if( pCsr->pSorter && pConfig->eDetail==FTS5_DETAIL_FULL ){
      Fts5Sorter *pSorter = pCsr->pSorter;
      int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
      *pn = pSorter->aIdx[iPhrase] - i1;
      *pa = &pSorter->aPoslist[i1];
    }else{
      *pn = sqlite3Fts5ExprPoslist(pCsr->pExpr, iPhrase, pa);
    }
  }else{
    *pa = 0;
    *pn = 0;
  }

  return rc;
}